

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaImpl::AddCleanup
          (ArenaImpl *this,void *elem,_func_void_void_ptr *cleanup)

{
  SerialArena *pSVar1;
  long *in_FS_OFFSET;
  
  if (in_FS_OFFSET[-2] == this->lifecycle_id_) {
    pSVar1 = (SerialArena *)in_FS_OFFSET[-1];
  }
  else {
    pSVar1 = (this->hint_)._M_b._M_p;
    if ((pSVar1 == (SerialArena *)0x0) || (pSVar1->owner_ != (void *)(*in_FS_OFFSET + -0x10))) {
      pSVar1 = GetSerialArena(this);
      SerialArena::AddCleanup(pSVar1,elem,cleanup);
      return;
    }
  }
  SerialArena::AddCleanup(pSVar1,elem,cleanup);
  return;
}

Assistant:

inline PROTOBUF_ALWAYS_INLINE bool ArenaImpl::GetSerialArenaFast(
    ArenaImpl::SerialArena** arena) {
  // If this thread already owns a block in this arena then try to use that.
  // This fast path optimizes the case where multiple threads allocate from the
  // same arena.
  ThreadCache* tc = &thread_cache();
  if (PROTOBUF_PREDICT_TRUE(tc->last_lifecycle_id_seen == lifecycle_id_)) {
    *arena = tc->last_serial_arena;
    return true;
  }

  // Check whether we own the last accessed SerialArena on this arena.  This
  // fast path optimizes the case where a single thread uses multiple arenas.
  SerialArena* serial = hint_.load(std::memory_order_acquire);
  if (PROTOBUF_PREDICT_TRUE(serial != NULL && serial->owner() == tc)) {
    *arena = serial;
    return true;
  }

  return false;
}